

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Return * __thiscall Parser::return_stmt(Parser *this)

{
  uint uVar1;
  int iVar2;
  Return *pRVar3;
  ulong uVar4;
  Expr *pEVar5;
  pointer pTVar6;
  ulong uVar7;
  bool bVar8;
  
  pRVar3 = (Return *)operator_new(0x18);
  (pRVar3->super_Stmt).super_Node.kind = Return;
  (pRVar3->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__Return_00117cc0;
  pRVar3->expr = (Expr *)0x0;
  iVar2 = this->tok_i;
  uVar1 = iVar2 + 1;
  this->tok_i = uVar1;
  if (iVar2 < -1) {
LAB_0010f365:
    pTVar6 = &this->eof;
  }
  else {
    uVar4 = (ulong)uVar1;
    pTVar6 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 2) *
            -0x3333333333333333;
    if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_0010f365;
    pTVar6 = pTVar6 + uVar4;
  }
  this->tok = pTVar6;
  if (pTVar6->kind == Eof) goto LAB_0010f3f2;
  if ((pTVar6->kind == Punctuator) && (pTVar6->i == 0x3b)) {
    bVar8 = false;
LAB_0010f39e:
    if (pTVar6->i == 0x3b) {
      iVar2 = this->tok_i;
      uVar1 = iVar2 + 1;
      this->tok_i = uVar1;
      if (iVar2 < -1) {
LAB_0010f3e6:
        pTVar6 = &this->eof;
      }
      else {
        uVar4 = (ulong)uVar1;
        pTVar6 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 2) *
                -0x3333333333333333;
        if (uVar7 < uVar4 || uVar7 - uVar4 == 0) goto LAB_0010f3e6;
        pTVar6 = pTVar6 + uVar4;
      }
      this->tok = pTVar6;
    }
  }
  else {
    pEVar5 = additive_expression(this);
    pRVar3->expr = pEVar5;
    bVar8 = pEVar5 == (Expr *)0x0;
    pTVar6 = this->tok;
    if (pTVar6->kind == Punctuator) goto LAB_0010f39e;
  }
  if (!bVar8) {
    return pRVar3;
  }
LAB_0010f3f2:
  error<char_const(&)[49]>(this,(char (*) [49])"expecting \';\' or expression for return statement")
  ;
  return pRVar3;
}

Assistant:

Return* Parser::return_stmt()
{
  auto r = std::make_unique<Return>();
  bool err = false;

  if (next_token().kind != TokenKind::Eof) {
    if (!is_punctuator(';')) {
      r->expr = expression();
      if (!r->expr)
        err = true;
    }
    if (is_punctuator(';')) {
      next_token(); // Skip ';', return with expression
    }
  }
  else
    err = true;

  if (err)
    error("expecting ';' or expression for return statement");

  return r.release();
}